

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O3

LngLat mercatortile::lnglat(double *x,double *y)

{
  double dVar1;
  LngLat LVar2;
  
  LVar2.lng = (*x * 57.29577951308232) / 6378137.0;
  dVar1 = exp(*y / -6378137.0);
  dVar1 = atan(dVar1);
  LVar2.lat = (1.5707963267948966 - (dVar1 + dVar1)) * 57.29577951308232;
  return LVar2;
}

Assistant:

LngLat lnglat(const double &x, const double &y)
{
    LngLat out;
    double R2D = 180 / M_PI;
    double A = 6378137.0;
    out.lng = x * R2D / A;
    out.lat = ((M_PI * 0.5) - 2.0 * atan(exp(-y / A))) * R2D;

    return out;
}